

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  __type _Var1;
  ostream *poVar2;
  Functional local_a0 [39];
  allocator local_79;
  string local_78 [8];
  string expectedString;
  allocator<int> local_45;
  int local_44 [3];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> test;
  
  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_44[0] = 1;
  local_44[1] = 3;
  local_44[2] = 0x22;
  local_38 = local_44;
  local_30 = 3;
  std::allocator<int>::allocator(&local_45);
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,__l,&local_45);
  std::allocator<int>::~allocator(&local_45);
  poVar2 = std::operator<<((ostream *)&std::cout,"Test mkString...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"1 3 34",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Functional::mkString<std::vector,_int,_std::allocator<int>_>
            (local_a0,(vector<int,_std::allocator<int>_> *)local_28," ");
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_a0);
  if (!_Var1) {
    __assert_fail("expectedString==Functional::mkString(test)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/mkString/main.cpp"
                  ,0x12,"int main()");
  }
  std::__cxx11::string::~string((string *)local_a0);
  poVar2 = std::operator<<((ostream *)&std::cout,"passed!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::__cxx11::string::~string(local_78);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return test.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_;
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34};
  
  cout << "Test mkString..." << endl;
  string expectedString="1 3 34";
  assert(expectedString==Functional::mkString(test));
  cout << "passed!" << endl;
  
  return 0;

}